

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dino.c
# Opt level: O1

int response_printf(DHANDLE dhandle,char *fmt,...)

{
  void *data;
  char in_AL;
  int iVar1;
  size_t size;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  va_list ap;
  char *result;
  
  ap[0].overflow_arg_area = local_e8;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  ap[0]._0_8_ = &stack0x00000008;
  local_38 = 0x3000000010;
  ap[0].reg_save_area = (void *)0x0;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  iVar1 = vasprintf((char **)&ap[0].reg_save_area,fmt,&local_38);
  data = ap[0].reg_save_area;
  if (ap[0].reg_save_area != (void *)0x0 && 0 < iVar1) {
    size = strlen((char *)ap[0].reg_save_area);
    response_send(dhandle,(char *)data,size);
    memory_free(ap[0].reg_save_area);
  }
  return 0;
}

Assistant:

int DINO_EXPORT response_printf(DHANDLE dhandle, const char *fmt, ...) {
    // Points to each unnamed arg in turn
    //
    va_list ap;

    // make ap point to 1st unnamed arg
    //
    va_start(ap, fmt);

    char *result = NULL;
    if (vasprintf(&result, fmt, ap) > 0) {
        if (NULL != result) {
            // now call the send method
            //
            response_send(dhandle, result, strlen(result));

            // Free the memory
            memory_free(result);
        }
    }

    // clean up when done
    //
    va_end(ap);

    return 0;
}